

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vwdll.cpp
# Opt level: O3

VW_HANDLE VW_InitializeWithModel(char *pstrArgs,char *modelData,size_t modelDataSize)

{
  memory_io_buf *this;
  vw *pvVar1;
  allocator local_41;
  string local_40;
  
  this = (memory_io_buf *)operator_new(200);
  memory_io_buf::memory_io_buf(this);
  (*(this->super_io_buf)._vptr_io_buf[6])(this,0xffffffff,modelData);
  std::__cxx11::string::string((string *)&local_40,pstrArgs,&local_41);
  pvVar1 = VW::initialize(&local_40,(io_buf *)this,false,(trace_message_t)0x0,(void *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  (*(this->super_io_buf)._vptr_io_buf[3])(this);
  return pvVar1;
}

Assistant:

VW_DLL_MEMBER VW_HANDLE VW_CALLING_CONV VW_InitializeWithModel(const char * pstrArgs, const char * modelData, size_t modelDataSize)
{
    unique_ptr<memory_io_buf> buf(new memory_io_buf);
    buf->write_file(-1, modelData, modelDataSize);

    vw* all = VW::initialize(string(pstrArgs), buf.get());
    return static_cast<VW_HANDLE>(all);
}